

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.c
# Opt level: O0

lzma_bool lzma_index_iter_next(lzma_index_iter *iter,lzma_index_iter_mode mode)

{
  size_t sVar1;
  void *pvVar2;
  bool bVar3;
  size_t local_40;
  size_t record;
  index_group *group;
  index_stream *stream;
  lzma_index *i;
  lzma_index_iter_mode mode_local;
  lzma_index_iter *iter_local;
  
  if (mode < 4) {
    sVar1 = iter->internal[0].s;
    group = (index_group *)iter->internal[1].p;
    record = 0;
    local_40 = iter->internal[3].s;
    if (mode != LZMA_INDEX_ITER_STREAM) {
      pvVar2 = iter->internal[4].p;
      if (pvVar2 == (void *)0x0) {
        record = iter->internal[2].s;
      }
      else if (pvVar2 == (void *)0x1) {
        record = (size_t)index_tree_next((index_tree_node *)iter->internal[2].p);
      }
      else if (pvVar2 == (void *)0x2) {
        record = group[1].node.uncompressed_base;
      }
    }
    do {
      while( true ) {
        if (group == (index_group *)0x0) {
          group = *(index_group **)(sVar1 + 8);
          if (LZMA_INDEX_ITER_STREAM < mode) {
            while (group[1].node.uncompressed_base == 0) {
              group = (index_group *)index_tree_next(&group->node);
              if (group == (index_group *)0x0) {
                return '\x01';
              }
            }
          }
          record = group[1].node.uncompressed_base;
          local_40 = 0;
        }
        else if ((record == 0) || (*(ulong *)(record + 0x38) <= local_40)) {
          local_40 = 0;
          if (record != 0) {
            record = (size_t)index_tree_next((index_tree_node *)record);
          }
          if (record == 0) {
            do {
              group = (index_group *)index_tree_next(&group->node);
              if (group == (index_group *)0x0) {
                return '\x01';
              }
              bVar3 = false;
              if (LZMA_INDEX_ITER_STREAM < mode) {
                bVar3 = group[1].node.uncompressed_base == 0;
              }
            } while (bVar3);
            record = group[1].node.uncompressed_base;
          }
        }
        else {
          local_40 = local_40 + 1;
        }
        if (mode != LZMA_INDEX_ITER_NONEMPTY_BLOCK) goto LAB_0094a166;
        if (local_40 != 0) break;
        if (*(long *)record != *(long *)(record + 0x40)) goto LAB_0094a166;
      }
    } while (*(long *)(record + 0x40 + (local_40 - 1) * 0x10) ==
             *(long *)(record + 0x40 + local_40 * 0x10));
LAB_0094a166:
    iter->internal[1].p = group;
    iter->internal[2].s = record;
    iter->internal[3].s = local_40;
    iter_set_info(iter);
    iter_local._7_1_ = '\0';
  }
  else {
    iter_local._7_1_ = '\x01';
  }
  return iter_local._7_1_;
}

Assistant:

extern LZMA_API(lzma_bool)
lzma_index_iter_next(lzma_index_iter *iter, lzma_index_iter_mode mode)
{
	const lzma_index *i;
	const index_stream *stream;
	const index_group *group;
	size_t record;

	// Catch unsupported mode values.
	if ((unsigned int)(mode) > LZMA_INDEX_ITER_NONEMPTY_BLOCK)
		return true;

	i = iter->internal[ITER_INDEX].p;
	stream = iter->internal[ITER_STREAM].p;
	group = NULL;
	record = iter->internal[ITER_RECORD].s;

	// If we are being asked for the next Stream, leave group to NULL
	// so that the rest of the this function thinks that this Stream
	// has no groups and will thus go to the next Stream.
	if (mode != LZMA_INDEX_ITER_STREAM) {
		// Get the pointer to the current group. See iter_set_inf()
		// for explanation.
		switch (iter->internal[ITER_METHOD].s) {
		case ITER_METHOD_NORMAL:
			group = iter->internal[ITER_GROUP].p;
			break;

		case ITER_METHOD_NEXT:
			group = index_tree_next(iter->internal[ITER_GROUP].p);
			break;

		case ITER_METHOD_LEFTMOST:
			group = (const index_group *)(
					stream->groups.leftmost);
			break;
		}
	}

again:
	if (stream == NULL) {
		// We at the beginning of the lzma_index.
		// Locate the first Stream.
		stream = (const index_stream *)(i->streams.leftmost);
		if (mode >= LZMA_INDEX_ITER_BLOCK) {
			// Since we are being asked to return information
			// about the first a Block, skip Streams that have
			// no Blocks.
			while (stream->groups.leftmost == NULL) {
				stream = index_tree_next(&stream->node);
				if (stream == NULL)
					return true;
			}
		}

		// Start from the first Record in the Stream.
		group = (const index_group *)(stream->groups.leftmost);
		record = 0;

	} else if (group != NULL && record < group->last) {
		// The next Record is in the same group.
		++record;

	} else {
		// This group has no more Records or this Stream has
		// no Blocks at all.
		record = 0;

		// If group is not NULL, this Stream has at least one Block
		// and thus at least one group. Find the next group.
		if (group != NULL)
			group = index_tree_next(&group->node);

		if (group == NULL) {
			// This Stream has no more Records. Find the next
			// Stream. If we are being asked to return information
			// about a Block, we skip empty Streams.
			do {
				stream = index_tree_next(&stream->node);
				if (stream == NULL)
					return true;
			} while (mode >= LZMA_INDEX_ITER_BLOCK
					&& stream->groups.leftmost == NULL);

			group = (const index_group *)(
					stream->groups.leftmost);
		}
	}

	if (mode == LZMA_INDEX_ITER_NONEMPTY_BLOCK) {
		// We need to look for the next Block again if this Block
		// is empty.
		if (record == 0) {
			if (group->node.uncompressed_base
					== group->records[0].uncompressed_sum)
				goto again;
		} else if (group->records[record - 1].uncompressed_sum
				== group->records[record].uncompressed_sum) {
			goto again;
		}
	}

	iter->internal[ITER_STREAM].p = stream;
	iter->internal[ITER_GROUP].p = group;
	iter->internal[ITER_RECORD].s = record;

	iter_set_info(iter);

	return false;
}